

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToString.hpp
# Opt level: O2

string * __thiscall
ut11::utility::detail::
ParseIterableToString<std::vector<ut11::Category,std::allocator<ut11::Category>>>::
operator()[abi_cxx11_
          (string *__return_storage_ptr__,void *this,
          vector<ut11::Category,_std::allocator<ut11::Category>_> *value)

{
  pointer pCVar1;
  ostream *poVar2;
  pointer value_00;
  stringstream stream;
  string sStack_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"{ ");
  pCVar1 = (value->super__Vector_base<ut11::Category,_std::allocator<ut11::Category>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (value_00 = (value->super__Vector_base<ut11::Category,_std::allocator<ut11::Category>_>).
                  _M_impl.super__Vector_impl_data._M_start; value_00 != pCVar1;
      value_00 = value_00 + 1) {
    ToString<ut11::Category>(&sStack_1d8,value_00);
    poVar2 = std::operator<<(local_1a8,(string *)&sStack_1d8);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string((string *)&sStack_1d8);
  }
  std::operator<<(local_1a8,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string operator()(const V& value) const
				{
					std::stringstream stream;
					stream << "{ ";
					for (const auto& arg : value)
						stream << ToString(arg) << " ";
					stream << "}";
					return stream.str();
				}